

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O1

unsigned_long bhf::StringTo<unsigned_long>(string *v,unsigned_long value)

{
  long lVar1;
  code *pcVar2;
  stringstream converter;
  stringstream local_198 [16];
  long local_188 [14];
  ios_base local_118 [264];
  
  if (v->_M_string_length != 0) {
    lVar1 = std::__cxx11::string::rfind((char *)v,0x10f441,0);
    std::__cxx11::stringstream::stringstream(local_198);
    pcVar2 = std::hex;
    if (lVar1 == -1) {
      pcVar2 = std::dec;
    }
    (*pcVar2)((ostream *)local_188 + *(long *)(local_188[0] + -0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,(v->_M_dataplus)._M_p,v->_M_string_length);
    std::istream::_M_extract<unsigned_long>((ulong *)local_198);
    std::__cxx11::stringstream::~stringstream(local_198);
    std::ios_base::~ios_base(local_118);
  }
  return value;
}

Assistant:

T StringTo(const std::string& v, T value = {})
{
    if (v.size()) {
        const auto asHex = (v.npos != v.rfind("0x", 0));
        std::stringstream converter;
        converter << (asHex ? std::hex : std::dec) << v;
        converter >> value;
    }
    return value;
}